

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::GetNode
          (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
           *this,FName *key)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_4;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key->Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == key->Index) {
LAB_002f6531:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,&local_4);
        (pNVar2->Pair).Value.args.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        (pNVar2->Pair).Value.device = -1;
      }
      return pNVar2;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_002f6531;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}